

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

void __thiscall Array<String>::reserve(Array<String> *this,usize size)

{
  String *pSVar1;
  String *pSVar2;
  String *this_00;
  String *src;
  String *other;
  
  other = (this->_begin).item;
  if (size <= this->_capacity) {
    if (size == 0 || other != (String *)0x0) {
      return;
    }
    other = (String *)0x0;
    size = this->_capacity;
  }
  this->_capacity = size | 3;
  pSVar2 = (String *)operator_new__((size | 3) * 0x28);
  this_00 = pSVar2;
  if (other != (String *)0x0) {
    pSVar1 = (this->_end).item;
    if (other != pSVar1) {
      do {
        String::String(this_00,other);
        String::~String(other);
        other = other + 1;
        this_00 = this_00 + 1;
      } while (other != pSVar1);
      other = (this->_begin).item;
      if (other == (String *)0x0) goto LAB_00112a28;
    }
    operator_delete__(other);
  }
LAB_00112a28:
  (this->_begin).item = pSVar2;
  (this->_end).item = this_00;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }